

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
Find<phmap::parallel_node_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(Find<phmap::parallel_node_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  pointer ppVar1;
  long lVar2;
  pointer ppVar3;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  values;
  iterator it;
  TypeParam m;
  Message local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_558;
  AssertHelper local_550;
  string local_548;
  undefined1 local_528 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_508;
  AssertHelper local_4f0;
  undefined1 local_4e8 [24];
  anon_union_8_1_a8a14541_for_iterator_1 local_4d0;
  long alStack_4c8 [3];
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_4b0;
  
  local_508.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pair<const_phmap::priv::NonStandardLayout,_int> *)0x0
  ;
  local_508.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<const_phmap::priv::NonStandardLayout,_int> *)0x0;
  local_508.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  generate_n<std::back_insert_iterator<std::vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>>,int,phmap::priv::hash_internal::Generator<std::pair<phmap::priv::NonStandardLayout_const,int>,void>>
            ();
  ppVar1 = local_508.
           super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = 0x40;
  do {
    *(undefined8 *)(local_4e8 + lVar2 + 8) = 0;
    *(undefined8 *)(local_4e8 + lVar2 + 0x10) = 0;
    *(undefined8 *)((long)&local_4f0.data_ + lVar2) = 0;
    *(undefined8 *)(local_4e8 + lVar2) = 0;
    *(undefined8 *)((long)alStack_4c8 + lVar2) = 0;
    *(long *)((long)alStack_4c8 + lVar2 + 8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)alStack_4c8 + lVar2 + 0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_4b0.sets_._M_elems[0].set_.ctrl_ + lVar2) = 0;
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0x4c0);
  if (local_508.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_508.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar3 = local_508.
             super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ::find<phmap::priv::NonStandardLayout>((iterator *)local_4e8,&local_4b0,&ppVar3->first);
      local_528[0] = (internal)((Inner *)local_4e8._0_8_ == (Inner *)0x0);
      local_520 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_528[0]) {
        testing::Message::Message(&local_560);
        testing::PrintToString<phmap::priv::NonStandardLayout>((string *)local_4e8,&ppVar3->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT71(local_560.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_560.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) + 0x10),(char *)local_4e8._0_8_,local_4e8._8_8_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_548,(internal *)local_528,(AssertionResult *)"m.end() == m.find(p.first)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_550,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x58,local_548._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_550,&local_560);
        testing::internal::AssertHelper::~AssertHelper(&local_550);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        if ((Inner *)local_4e8._0_8_ != (Inner *)(local_4e8 + 0x10)) {
          operator_delete((void *)local_4e8._0_8_,(ulong)(local_4e8._16_8_ + 1));
        }
        if ((long *)CONCAT71(local_560.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_560.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_560.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._1_7_,
                                         local_560.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_1_) + 8))();
        }
      }
      if (local_520 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_520,local_520);
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar1);
  }
  ppVar1 = local_508.
           super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_508.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_508.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar3 = local_508.
             super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ::emplace<const_std::pair<const_phmap::priv::NonStandardLayout,_int>_&,_0>
                ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
                  *)local_4e8,&local_4b0,ppVar3);
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar1);
  }
  ppVar1 = local_508.
           super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_508.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_508.
      super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar3 = local_508.
             super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ::find<phmap::priv::NonStandardLayout>((iterator *)local_4e8,&local_4b0,&ppVar3->first);
      local_560.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)((Inner *)local_4e8._0_8_ != (Inner *)0x0);
      local_558 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_560.ss_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_1_) {
        testing::Message::Message((Message *)&local_550);
        testing::PrintToString<phmap::priv::NonStandardLayout>(&local_548,&ppVar3->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_550.data_)->line,local_548._M_dataplus._M_p,
                   local_548._M_string_length);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_528,(internal *)&local_560,(AssertionResult *)"m.end() != it",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x5d,(char *)CONCAT71(local_528._1_7_,local_528[0]));
        testing::internal::AssertHelper::operator=(&local_4f0,(Message *)&local_550);
        testing::internal::AssertHelper::~AssertHelper(&local_4f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_528._1_7_,local_528[0]) != &local_518) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_528._1_7_,local_528[0]),
                          local_518._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        if (local_550.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_550.data_ + 8))();
        }
      }
      if (local_558 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_558,local_558);
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_528,"p.second","get<1>(*it)",&ppVar3->second,
                 &(*local_4d0.slot_)->second);
      if (local_528[0] == (internal)0x0) {
        testing::Message::Message(&local_560);
        testing::PrintToString<phmap::priv::NonStandardLayout>(&local_548,&ppVar3->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT71(local_560.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_560.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) + 0x10),local_548._M_dataplus._M_p,
                   local_548._M_string_length);
        message = "";
        if (local_520 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = (local_520->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_550,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x5e,message);
        testing::internal::AssertHelper::operator=(&local_550,&local_560);
        testing::internal::AssertHelper::~AssertHelper(&local_550);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT71(local_560.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_560.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_560.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._1_7_,
                                         local_560.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_1_) + 8))();
        }
      }
      if (local_520 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_520,local_520);
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar1);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~parallel_hash_set(&local_4b0);
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector(&local_508);
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, EqualRange) {
  using std::get;
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(0, std::distance(r.first, r.second));
  }
  m.insert(values.begin(), values.end());
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(1, std::distance(r.first, r.second));
    EXPECT_EQ(p.second, get<1>(*r.first)) << ::testing::PrintToString(p.first);
  }
}